

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

pair<helics::route_id,_helics::ActionMessage> * __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
::pop(BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      *this)

{
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  long in_RSI;
  pair<helics::route_id,_helics::ActionMessage> *in_RDI;
  unique_lock<std::mutex> pullLock;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> val;
  pair<helics::route_id,_helics::ActionMessage> *actval;
  reference in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  undefined7 in_stack_fffffffffffffe10;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffffe38;
  
  bVar1 = false;
  std::pair<helics::route_id,_helics::ActionMessage>::
  pair<helics::route_id,_helics::ActionMessage,_true>
            ((pair<helics::route_id,_helics::ActionMessage> *)
             CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  try_pop(in_stack_fffffffffffffe38);
  do {
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x46e9a1);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator*
                ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x46ec33);
      std::pair<helics::route_id,_helics::ActionMessage>::operator=
                ((pair<helics::route_id,_helics::ActionMessage> *)
                 CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdf8);
      bVar1 = true;
      break;
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               (mutex_type *)in_stack_fffffffffffffdf8);
    uVar3 = std::
            queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
            ::empty((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                     *)0x46e9d5);
    if ((bool)uVar3) {
      bVar2 = std::
              vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
              ::empty((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                       *)CONCAT17(uVar3,in_stack_fffffffffffffe10));
      if (bVar2) {
        std::condition_variable::wait((unique_lock *)(in_RSI + 0xd8));
        in_stack_fffffffffffffe07 =
             std::
             queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
             ::empty((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                      *)0x46eb10);
        if ((bool)in_stack_fffffffffffffe07) {
          bVar2 = std::
                  vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                  ::empty((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                           *)CONCAT17(uVar3,in_stack_fffffffffffffe10));
          if (bVar2) {
            std::unique_lock<std::mutex>::unlock
                      ((unique_lock<std::mutex> *)
                       CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
            try_pop(in_stack_fffffffffffffe38);
            std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator=
                      ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                       CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                       (optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                       in_stack_fffffffffffffdf8);
            std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::~optional
                      ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x46ebfc);
            bVar2 = false;
          }
          else {
            std::
            vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
            ::back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
            std::pair<helics::route_id,_helics::ActionMessage>::operator=
                      ((pair<helics::route_id,_helics::ActionMessage> *)
                       CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                       in_stack_fffffffffffffdf8);
            std::
            vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
            ::pop_back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                        *)0x46ebab);
            bVar1 = true;
            bVar2 = true;
          }
        }
        else {
          in_stack_fffffffffffffdf8 =
               std::
               queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
               ::front((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                        *)0x46eb31);
          std::pair<helics::route_id,_helics::ActionMessage>::operator=
                    ((pair<helics::route_id,_helics::ActionMessage> *)
                     CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdf8);
          std::
          queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
          ::pop((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                 *)0x46eb56);
          bVar1 = true;
          bVar2 = true;
        }
      }
      else {
        std::
        vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ::back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
        std::pair<helics::route_id,_helics::ActionMessage>::operator=
                  ((pair<helics::route_id,_helics::ActionMessage> *)
                   CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                   in_stack_fffffffffffffdf8);
        std::
        vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ::pop_back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                    *)0x46eace);
        bVar1 = true;
        bVar2 = true;
      }
    }
    else {
      std::
      queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
      ::front((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
               *)0x46e9fa);
      std::pair<helics::route_id,_helics::ActionMessage>::operator=
                ((pair<helics::route_id,_helics::ActionMessage> *)
                 CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdf8);
      std::
      queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
      ::pop((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
             *)0x46ea21);
      bVar1 = true;
      bVar2 = true;
    }
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  } while (!bVar2);
  std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::~optional
            ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x46ec60);
  if (!bVar1) {
    std::pair<helics::route_id,_helics::ActionMessage>::~pair
              ((pair<helics::route_id,_helics::ActionMessage> *)0x46ec85);
  }
  return in_RDI;
}

Assistant:

T pop()
        {
            T actval;
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                condition.wait(pullLock);  // now wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                pullLock.unlock();
                val = try_pop();
            }
            // move the value out of the optional
            actval = std::move(*val);
            return actval;
        }